

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O3

int If_CutPerformCheck75(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  If_Par_t *pIVar9;
  undefined1 *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  undefined1 *puVar15;
  ulong uVar16;
  undefined1 *puVar17;
  word *pLimit;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  char pDsdStr [1000];
  char *in_stack_fffffffffffffb88;
  undefined1 local_468 [8];
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  If_Par_t *local_440;
  If_Man_t *local_438;
  char *local_430;
  uint local_424;
  ulong local_420;
  char local_418 [1000];
  
  local_468 = *(undefined1 (*) [8])pTruth0;
  uStack_460 = *(undefined8 *)(pTruth0 + 2);
  local_458 = *(undefined8 *)(pTruth0 + 4);
  uStack_450 = *(undefined8 *)(pTruth0 + 6);
  if (8 < nLeaves) {
    __assert_fail("nLeaves <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                  ,0x133,"int If_CutPerformCheck75(If_Man_t *, unsigned int *, int, int, char *)");
  }
  pIVar9 = p->pPars;
  uVar6 = nLeaves;
  if (pIVar9->fCutMin == 0) {
    if (nLeaves < 1) {
      return 1;
    }
    local_440 = pIVar9;
    local_438 = p;
    local_430 = pStr;
    uVar16 = (ulong)(uint)(1 << ((char)nLeaves - 6U & 0x1f));
    local_420 = (ulong)(uint)nLeaves;
    uVar11 = 0;
    uVar18 = 0;
    uVar6 = 0;
LAB_0041c1b6:
    bVar8 = (byte)uVar11;
    if ((uint)nLeaves < 7) {
      uVar13 = 1 << (bVar8 & 0x1f);
      bVar20 = (((ulong)local_468 >> ((byte)uVar13 & 0x3f) ^ (ulong)local_468) &
               s_Truths6Neg[uVar11]) != 0;
      if (!bVar20) {
        uVar13 = 0;
      }
      uVar6 = uVar6 + bVar20;
    }
    else if (uVar11 < 6) {
      uVar13 = 1 << (bVar8 & 0x1f);
      uVar19 = 0;
      do {
        if (((*(ulong *)(local_468 + uVar19 * 8) >> ((byte)uVar13 & 0x3f) ^
             *(ulong *)(local_468 + uVar19 * 8)) & s_Truths6Neg[uVar11]) != 0) goto LAB_0041c271;
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
      uVar13 = 0 << (bVar8 & 0x1f);
    }
    else {
      uVar19 = (ulong)(uint)(1 << (bVar8 - 6 & 0x1f));
      puVar15 = local_468 + uVar19 * 8;
      lVar14 = (ulong)(uint)(2 << (bVar8 - 6 & 0x1f)) * 8;
      puVar10 = local_468;
      do {
        uVar7 = 0;
        do {
          if (*(long *)(puVar10 + uVar7 * 8) != *(long *)(puVar15 + uVar7 * 8)) {
            uVar13 = 1 << (bVar8 & 0x1f);
            goto LAB_0041c271;
          }
          uVar7 = uVar7 + 1;
        } while (uVar19 != uVar7);
        puVar10 = puVar10 + lVar14;
        puVar15 = puVar15 + lVar14;
        uVar13 = 0;
      } while (puVar10 < local_468 + uVar16 * 8);
    }
    goto LAB_0041c277;
  }
LAB_0041c0d6:
  uVar18 = 1;
  if (5 < (int)uVar6) {
    if (uVar6 < 8) {
      iVar5 = If_CutPerformCheck16(p,(uint *)local_468,nVars,uVar6,"44");
      if (iVar5 != 0) {
        return 1;
      }
      pIVar9 = p->pPars;
    }
    if (((pIVar9->fDeriveLuts == 0) && (uVar6 == 8)) && (pIVar9->fEnableCheck75 != 0)) {
      uVar18 = 0;
      iVar5 = Dau_DsdDecompose((word *)local_468,8,0,0,local_418);
      if (iVar5 < 5) {
        uVar6 = Dau_DsdCheckDecAndExist(in_stack_fffffffffffffb88);
        uVar18 = uVar6 >> 4 & 1;
      }
    }
    else {
      iVar5 = If_CutPerformCheck45(p,(uint *)local_468,nVars,uVar6,pStr);
      if (iVar5 == 0) {
        iVar5 = If_CutPerformCheck54(p,(uint *)local_468,nVars,uVar6,pStr);
        uVar18 = (uint)(iVar5 != 0);
      }
    }
  }
  return uVar18;
LAB_0041c271:
  uVar6 = uVar6 + 1;
LAB_0041c277:
  uVar18 = uVar18 | uVar13;
  uVar11 = uVar11 + 1;
  if (uVar11 == (uint)nLeaves) goto code_r0x0041c288;
  goto LAB_0041c1b6;
code_r0x0041c288:
  if (uVar18 != 0) {
    if ((int)uVar18 < 1) {
      __assert_fail("Supp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x575,"int Abc_TtSuppIsMinBase(int)");
    }
    if ((uVar18 + 1 & uVar18) != 0) {
      if ((uint)nLeaves < 7) {
        uVar16 = 1;
      }
      uVar11 = 0;
      uVar13 = 0;
      local_424 = uVar6;
      do {
        if ((uVar18 >> ((uint)uVar11 & 0x1f) & 1) != 0) {
          if ((int)uVar13 < (int)(uint)uVar11) {
            uVar19 = uVar11;
            do {
              uVar7 = uVar19 - 1;
              if ((long)uVar19 < 6) {
                uVar19 = s_PMasks[uVar7][0];
                uVar1 = s_PMasks[uVar7][1];
                uVar2 = s_PMasks[uVar7][2];
                uVar12 = 0;
                do {
                  uVar3 = *(ulong *)(local_468 + uVar12 * 8);
                  bVar8 = (byte)(1 << ((byte)uVar7 & 0x1f));
                  *(ulong *)(local_468 + uVar12 * 8) =
                       (uVar3 & uVar2) >> (bVar8 & 0x3f) |
                       (uVar3 & uVar1) << (bVar8 & 0x3f) | uVar3 & uVar19;
                  uVar12 = uVar12 + 1;
                } while (uVar16 != uVar12);
              }
              else if (uVar7 == 5) {
                puVar10 = local_468;
                do {
                  *(ulong *)(puVar10 + 4) =
                       CONCAT44((int)*(undefined8 *)(puVar10 + 4),
                                (int)((ulong)*(undefined8 *)(puVar10 + 4) >> 0x20));
                  puVar10 = puVar10 + 0x10;
                } while (puVar10 < local_468 + uVar16 * 8);
              }
              else {
                uVar6 = 1 << ((char)uVar19 - 7U & 0x1f);
                if (uVar19 < 8) {
                  uVar6 = 1;
                }
                puVar15 = local_468 + (ulong)(uVar6 * 2) * 8;
                lVar14 = (long)(int)(uVar6 * 4) * 8;
                puVar17 = local_468 + (ulong)uVar6 * 8;
                puVar10 = local_468;
                do {
                  if (0 < (int)uVar6) {
                    uVar19 = 0;
                    do {
                      uVar4 = *(undefined8 *)(puVar17 + uVar19 * 8);
                      *(undefined8 *)(puVar17 + uVar19 * 8) = *(undefined8 *)(puVar15 + uVar19 * 8);
                      *(undefined8 *)(puVar15 + uVar19 * 8) = uVar4;
                      uVar19 = uVar19 + 1;
                    } while (uVar6 != uVar19);
                  }
                  puVar10 = puVar10 + (long)(int)(uVar6 * 4) * 8;
                  puVar15 = puVar15 + lVar14;
                  puVar17 = puVar17 + lVar14;
                } while (puVar10 < local_468 + uVar16 * 8);
              }
              uVar19 = uVar7;
            } while ((long)(int)uVar13 < (long)uVar7);
          }
          uVar13 = uVar13 + 1;
          uVar6 = local_424;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != local_420);
      pIVar9 = local_440;
      p = local_438;
      pStr = local_430;
      if (uVar13 != uVar6) {
        __assert_fail("Var == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
      }
    }
  }
  goto LAB_0041c0d6;
}

Assistant:

int If_CutPerformCheck75( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    word * pTruthW = (word *)pTruth0;
    word pTruth[4] = { pTruthW[0], pTruthW[1], pTruthW[2], pTruthW[3] };
    assert( nLeaves <= 8 );
    if ( !p->pPars->fCutMin )
        Abc_TtMinimumBase( pTruth, NULL, nLeaves, &nLeaves );
    if ( nLeaves < 6 )
        return 1;
//    if ( nLeaves < 8 && If_CutPerformCheck07( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
    if ( nLeaves < 8 && If_CutPerformCheck16( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // this is faster but not compatible with -z
    if ( !p->pPars->fDeriveLuts && p->pPars->fEnableCheck75 && nLeaves == 8 )
    {
//        char pDsdStr[1000] = "(!(abd)!(c!([fe][gh])))";
        char pDsdStr[1000];
        int nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
        if ( nSizeNonDec >= 5 )
            return 0;
        if ( Dau_DsdCheckDecAndExist(pDsdStr) & 0x10 ) // bit 4
            return 1;
        return 0;
    }
    if ( If_CutPerformCheck45( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    if ( If_CutPerformCheck54( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    return 0;
}